

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

boolean maybe_cannibal(int pm,boolean allowmsg)

{
  int iVar1;
  boolean allowmsg_local;
  int pm_local;
  
  if ((((urole.malenum == 0x15b) || (urace.malenum == 0x4a)) || (urace.malenum == 0xe8)) ||
     ((mons[pm].mflags2 & (int)urace.selfmask) == 0)) {
    allowmsg_local = '\0';
  }
  else {
    if (allowmsg != '\0') {
      if (u.umonnum != u.umonster) {
        pline("You have a bad feeling deep inside.");
      }
      pline("You cannibal!  You will regret this!");
    }
    u.uprops[0x14].intrinsic = u.uprops[0x14].intrinsic | 0x4000000;
    iVar1 = rn2(4);
    change_luck(-((char)iVar1 + '\x02'));
    allowmsg_local = '\x01';
  }
  return allowmsg_local;
}

Assistant:

static boolean maybe_cannibal(int pm, boolean allowmsg)
{
	if (!CANNIBAL_ALLOWED() && your_race(&mons[pm])) {
		if (allowmsg) {
			if (Upolyd)
				pline("You have a bad feeling deep inside.");
			pline("You cannibal!  You will regret this!");
		}
		HAggravate_monster |= FROMOUTSIDE;
		change_luck(-rn1(4,2));		/* -5..-2 */
		return TRUE;
	}
	return FALSE;
}